

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

long Assimp::IOSystem2Unzip::seek(voidpf param_1,voidpf stream,uLong offset,int origin)

{
  char cVar1;
  int iVar2;
  
  cVar1 = (origin == 2) + '\x01';
  if (origin == 0) {
    cVar1 = '\0';
  }
  iVar2 = (**(code **)(*stream + 0x20))(stream,offset,cVar1);
  return -(ulong)(iVar2 != 0);
}

Assistant:

long IOSystem2Unzip::seek(voidpf /*opaque*/, voidpf stream, uLong offset, int origin) {
        IOStream* io_stream = (IOStream*)stream;

        aiOrigin assimp_origin;
        switch (origin) {
        default:
        case ZLIB_FILEFUNC_SEEK_CUR:
            assimp_origin = aiOrigin_CUR;
            break;
        case ZLIB_FILEFUNC_SEEK_END:
            assimp_origin = aiOrigin_END;
            break;
        case ZLIB_FILEFUNC_SEEK_SET:
            assimp_origin = aiOrigin_SET;
            break;
        }

        return (io_stream->Seek(offset, assimp_origin) == aiReturn_SUCCESS ? 0 : -1);
    }